

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O3

void srunner_set_fork_status(SRunner *sr,fork_status fstat)

{
  sr->fstat = fstat;
  return;
}

Assistant:

void srunner_set_fork_status(SRunner * sr, enum fork_status fstat)
{
#if !defined(HAVE_FORK) || HAVE_FORK==0
    /* If fork() is unavailable, do not allow a fork mode to be set */
    if(fstat != CK_NOFORK)
    {
        /* Overriding, as Check is not compiled with fork support. */
        fstat = CK_NOFORK;
    }
#endif /* ! HAVE_FORK */
    sr->fstat = fstat;
}